

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::DoDelete(Benchmark *this,ThreadState *thread,bool seq)

{
  FILE *__stream;
  Status SVar1;
  uint32_t uVar2;
  ulong uVar3;
  int j;
  int iVar4;
  int iVar5;
  Status s;
  Slice local_f0;
  WriteBatch batch;
  RandomGenerator gen;
  char key [100];
  
  anon_unknown_0::RandomGenerator::RandomGenerator(&gen);
  WriteBatch::WriteBatch(&batch);
  s.state_ = (char *)0x0;
  iVar5 = 0;
  while( true ) {
    if (this->num_ <= iVar5) {
      Status::~Status(&s);
      WriteBatch::~WriteBatch(&batch);
      std::__cxx11::string::_M_dispose();
      return;
    }
    WriteBatch::Clear(&batch);
    for (iVar4 = 0; iVar4 < this->entries_per_batch_; iVar4 = iVar4 + 1) {
      if (seq) {
        uVar3 = (ulong)(uint)(iVar5 + iVar4);
      }
      else {
        uVar2 = Random::Next(&thread->rand);
        uVar3 = (ulong)uVar2 % (ulong)(uint)FLAGS_num;
      }
      snprintf(key,100,"%016d",uVar3);
      local_f0.data_ = key;
      local_f0.size_ = strlen(key);
      WriteBatch::Delete(&batch,&local_f0);
      anon_unknown_0::Stats::FinishedSingleOp(&thread->stats);
    }
    (*this->db_->_vptr_DB[4])((Status *)key,this->db_,&this->write_options_,&batch);
    SVar1 = s;
    s.state_ = (char *)key._0_8_;
    key._0_8_ = SVar1.state_;
    Status::~Status((Status *)key);
    __stream = _stderr;
    if (s.state_ != (char *)0x0) break;
    iVar5 = iVar5 + this->entries_per_batch_;
  }
  Status::ToString_abi_cxx11_((string *)key,&s);
  fprintf(__stream,"del error: %s\n",key._0_8_);
  std::__cxx11::string::~string((string *)key);
  exit(1);
}

Assistant:

void DoDelete(ThreadState* thread, bool seq) {
    RandomGenerator gen;
    WriteBatch batch;
    Status s;
    for (int i = 0; i < num_; i += entries_per_batch_) {
      batch.Clear();
      for (int j = 0; j < entries_per_batch_; j++) {
        const int k = seq ? i + j : (thread->rand.Next() % FLAGS_num);
        char key[100];
        std::snprintf(key, sizeof(key), "%016d", k);
        batch.Delete(key);
        thread->stats.FinishedSingleOp();
      }
      s = db_->Write(write_options_, &batch);
      if (!s.ok()) {
        std::fprintf(stderr, "del error: %s\n", s.ToString().c_str());
        std::exit(1);
      }
    }
  }